

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::select_base::element::~element(element *this)

{
  booster::copy_ptr<cppcms::widgets::select_base::element::_data>::~copy_ptr(&this->d);
  booster::locale::basic_message<char>::~basic_message(&this->tr_option);
  std::__cxx11::string::~string((string *)&this->str_option);
  std::__cxx11::string::~string((string *)&this->id);
  return;
}

Assistant:

select_base::element::~element()
{
}